

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.h
# Opt level: O2

bool spvtools::utils::CheckRangeAndIfHexThenSignExtend<unsigned_long>
               (unsigned_long value,NumberType *type,bool is_hex,
               unsigned_long *updated_value_for_hex)

{
  uint32_t uVar1;
  ulong uVar2;
  undefined3 in_register_00000011;
  ulong uVar3;
  spv_number_kind_t sVar4;
  ulong uVar5;
  
  uVar1 = 0;
  if (type->kind - SPV_NUMBER_UNSIGNED_INT < 3) {
    uVar1 = type->bitwidth;
  }
  uVar3 = ~(-1L << ((byte)uVar1 & 0x3f));
  if (uVar1 == 0x40) {
    uVar3 = 0xffffffffffffffff;
  }
  sVar4 = type->kind & ~SPV_NUMBER_UNSIGNED_INT;
  uVar2 = uVar3;
  if (sVar4 == SPV_NUMBER_SIGNED_INT) {
    uVar2 = uVar3 >> 1;
  }
  if (CONCAT31(in_register_00000011,is_hex) != 0) {
    uVar2 = uVar3;
  }
  if (value <= uVar2) {
    uVar5 = 0;
    if (sVar4 == SPV_NUMBER_SIGNED_INT) {
      uVar5 = (uVar3 >> 1) + 1;
    }
    if ((is_hex) && ((uVar5 & value) != 0)) {
      *updated_value_for_hex = ~uVar3 | value;
    }
  }
  return value <= uVar2;
}

Assistant:

bool CheckRangeAndIfHexThenSignExtend(T value, const NumberType& type,
                                      bool is_hex, T* updated_value_for_hex) {
  // The encoded result has three regions of bits that are of interest, from
  // least to most significant:
  //   - magnitude bits, where the magnitude of the number would be stored if
  //     we were using a signed-magnitude representation.
  //   - an optional sign bit
  //   - overflow bits, up to bit 63 of a 64-bit number
  // For example:
  //   Type                Overflow      Sign       Magnitude
  //   ---------------     --------      ----       ---------
  //   unsigned 8 bit      8-63          n/a        0-7
  //   signed 8 bit        8-63          7          0-6
  //   unsigned 16 bit     16-63         n/a        0-15
  //   signed 16 bit       16-63         15         0-14

  // We'll use masks to define the three regions.
  // At first we'll assume the number is unsigned.
  const uint32_t bit_width = AssumedBitWidth(type);
  uint64_t magnitude_mask =
      (bit_width == 64) ? -1 : ((uint64_t(1) << bit_width) - 1);
  uint64_t sign_mask = 0;
  uint64_t overflow_mask = ~magnitude_mask;

  if (value < 0 || IsSigned(type)) {
    // Accommodate the sign bit.
    magnitude_mask >>= 1;
    sign_mask = magnitude_mask + 1;
  }

  bool failed = false;
  if (value < 0) {
    // The top bits must all be 1 for a negative signed value.
    failed = ((value & overflow_mask) != overflow_mask) ||
             ((value & sign_mask) != sign_mask);
  } else {
    if (is_hex) {
      // Hex values are a bit special. They decode as unsigned values, but may
      // represent a negative number. In this case, the overflow bits should
      // be zero.
      failed = (value & overflow_mask) != 0;
    } else {
      const uint64_t value_as_u64 = static_cast<uint64_t>(value);
      // Check overflow in the ordinary case.
      failed = (value_as_u64 & magnitude_mask) != value_as_u64;
    }
  }

  if (failed) {
    return false;
  }

  // Sign extend hex the number.
  if (is_hex && (value & sign_mask))
    *updated_value_for_hex = (value | overflow_mask);

  return true;
}